

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O2

bool IsHit(bitset<32UL> flags)

{
  unsigned_long uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  bitset<32UL> flags_local;
  bitset<32UL> flags_set;
  reference local_48;
  reference local_38;
  
  flags_local.super__Base_bitset<1UL>._M_w = flags.super__Base_bitset<1UL>._M_w;
  if (t_assoc == direct_mapped) {
    flags_set.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)0;
    j = 0;
    uVar2 = (uint)bit_block;
    for (i = (unsigned_long)uVar2; i < (ulong)bit_line + (ulong)uVar2; i = i + 1) {
      local_38._M_bpos = (size_t)((uint)i & 0x3f);
      local_48._M_bpos = (size_t)((uint)j & 0x3f);
      local_48._M_wp = (_WordT *)&flags_set;
      local_38._M_wp = (_WordT *)&flags_local;
      std::bitset<32UL>::reference::operator=(&local_48,&local_38);
      j = j + 1;
      uVar2 = (uint)bit_block;
    }
    current_line = (unsigned_long)flags_set.super__Base_bitset<1UL>._M_w;
    uVar3 = cache_item[(long)flags_set.super__Base_bitset<1UL>._M_w].super__Base_bitset<1UL>._M_w;
    if (((uint)uVar3 >> 0x1e & 1) != 0) {
      i = 0x1f;
      uVar4 = 0x1f - (ulong)bit_tag;
      while( true ) {
        j = i - 3;
        if (i <= uVar4) {
          return i <= uVar4;
        }
        if (((uVar3 >> (j & 0x3f) & 1) != 0) !=
            (((ulong)flags_local.super__Base_bitset<1UL>._M_w >> (i & 0x3f) & 1) != 0)) break;
        i = i - 1;
      }
      return i <= uVar4;
    }
  }
  else {
    if (t_assoc == set_associative) {
      flags_set.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)0;
      j = 0;
      uVar2 = (uint)bit_block;
      for (i = (unsigned_long)uVar2; i < (ulong)bit_set + (ulong)uVar2; i = i + 1) {
        local_38._M_bpos = (size_t)((uint)i & 0x3f);
        local_48._M_bpos = (size_t)((uint)j & 0x3f);
        local_48._M_wp = (_WordT *)&flags_set;
        local_38._M_wp = (_WordT *)&flags_local;
        std::bitset<32UL>::reference::operator=(&local_48,&local_38);
        j = j + 1;
        uVar2 = (uint)bit_block;
      }
      temp = i_cache_set * (long)flags_set.super__Base_bitset<1UL>._M_w;
      uVar3 = ((long)flags_set.super__Base_bitset<1UL>._M_w + 1) * i_cache_set;
      uVar1 = uVar3;
      if (uVar3 <= temp && temp - uVar3 != 0) {
        uVar1 = temp;
      }
      do {
        bVar5 = temp < uVar3;
        if (!bVar5) {
          current_set = (unsigned_long)flags_set.super__Base_bitset<1UL>._M_w;
          temp = uVar1;
          return bVar5;
        }
        uVar4 = cache_item[temp].super__Base_bitset<1UL>._M_w;
        if (((uint)uVar4 >> 0x1e & 1) != 0) {
          i = 0x1f;
          while( true ) {
            j = i - 3;
            if (i <= 0x1f - (ulong)bit_tag) {
              current_line = temp;
              current_set = (unsigned_long)flags_set.super__Base_bitset<1UL>._M_w;
              return bVar5;
            }
            if (((uVar4 >> (j & 0x3f) & 1) != 0) !=
                (((ulong)flags_local.super__Base_bitset<1UL>._M_w >> (i & 0x3f) & 1) != 0)) break;
            i = i - 1;
          }
        }
        temp = temp + 1;
      } while( true );
    }
    if (t_assoc == full_associative) {
      temp = i_num_line;
      for (uVar1 = 0; uVar1 != i_num_line; uVar1 = uVar1 + 1) {
        uVar3 = cache_item[uVar1].super__Base_bitset<1UL>._M_w;
        if (((uint)uVar3 >> 0x1e & 1) != 0) {
          i = 0x1f;
          while( true ) {
            j = i - 3;
            if (i <= 0x1f - (ulong)bit_tag) {
              current_line = uVar1;
              temp = uVar1;
              return true;
            }
            if (((uVar3 >> (j & 0x3f) & 1) != 0) !=
                (((ulong)flags.super__Base_bitset<1UL>._M_w >> (i & 0x3f) & 1) != 0)) break;
            i = i - 1;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool IsHit(bitset<32> flags)
{
    bool ret = false;

    if(t_assoc == direct_mapped)
    {
        bitset<32> flags_line; // a temp variable

        for(j=0,i=(bit_block); i<(bit_block+bit_line); j++,i++) //判断在cache多少行
        {
            flags_line[j] = flags[i];
        }

        current_line = flags_line.to_ulong();
        assert(cache_item[current_line][31] == true);

        if(cache_item[current_line][30]) //判断hit位是否为真
        {
            ret = true;

            for(i=31,j=28; i>(31ul-bit_tag); i--,j--) //判断标记是否相同,i:address,j:cache
            {
                if(flags[i] != cache_item[current_line][j])
                {
                    ret = false;
                    break;
                }
            }
        }
    }
    else if(t_assoc == full_associative)
    {
        for(temp=0; temp<i_num_line; temp++)
        {
            if(cache_item[temp][30]) //判断hit位是否为真
            {
                ret = true;

                for(i=31,j=28; i>(31ul-bit_tag); i--,j--) //判断标记是否相同,i:address,j:cache
                {
                    if(flags[i] != cache_item[temp][j])
                    {
                        ret = false;
                        break;
                    }
                }
            }

            if(ret)
            {
                current_line = temp;
                break;
            }
        }
    }
    else if(t_assoc == set_associative)
    {
        bitset<32> flags_set;

        for(j=0,i=(bit_block); i<(bit_block+bit_set); j++,i++) //判断在cache多少组
        {
            flags_set[j] = flags[i];
        }

        current_set = flags_set.to_ulong();

        for(temp=(current_set*i_cache_set); temp<((current_set+1)*i_cache_set); temp++)
        {
            if(cache_item[temp][30]) //判断hit位是否为真
            {
                ret = true;

                for(i=31,j=28; i>(31ul-bit_tag); i--,j--) //判断标记是否相同,i:address,j:cache
                {
                    if(flags[i] != cache_item[temp][j])
                    {
                        ret = false;
                        break;
                    }
                }
            }

            if(ret)
            {
                current_line = temp;
                break;
            }
        }
    }

    return ret;
}